

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonsterCards.cpp
# Opt level: O0

void __thiscall DeckOfMonsterCards::DeckOfMonsterCards(DeckOfMonsterCards *this)

{
  undefined1 local_f0 [8];
  MonsterCards singleCard;
  MonsterOptions local_20;
  MonsterOptions current;
  int i;
  DeckOfMonsterCards *this_local;
  
  std::vector<MonsterCards,_std::allocator<MonsterCards>_>::vector(&this->deck);
  __gnu_cxx::
  __normal_iterator<MonsterCards_*,_std::vector<MonsterCards,_std::allocator<MonsterCards>_>_>::
  __normal_iterator(&this->it);
  std::vector<MonsterCards,_std::allocator<MonsterCards>_>::reserve(&this->deck,6);
  for (local_20 = CaptainFish; (int)local_20 < 6; local_20 = local_20 + Sheriff) {
    singleCard.card = local_20;
    MonsterCards::MonsterCards((MonsterCards *)local_f0);
    MonsterCards::setMonster((MonsterCards *)local_f0,singleCard.card);
    std::vector<MonsterCards,_std::allocator<MonsterCards>_>::push_back
              (&this->deck,(MonsterCards *)local_f0);
    MonsterCards::~MonsterCards((MonsterCards *)local_f0);
  }
  return;
}

Assistant:

DeckOfMonsterCards::DeckOfMonsterCards() {
    deck.reserve(6);
    for(int i=0; i< MonsterCards::EnumEnd; i++) {
        auto current = (MonsterCards::MonsterOptions) i;
        MonsterCards singleCard;
        singleCard.setMonster(current);
        deck.push_back(singleCard);
    }
}